

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::Tag::Tag(Tag *this,string_view name)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this,name._M_str,name._M_str + name._M_len);
  (this->decl).has_func_type = false;
  Var::Var(&(this->decl).type_var);
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.param_type_names._M_h._M_buckets =
       &(this->decl).sig.param_type_names._M_h._M_single_bucket;
  (this->decl).sig.param_type_names._M_h._M_bucket_count = 1;
  (this->decl).sig.param_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decl).sig.param_type_names._M_h._M_element_count = 0;
  (this->decl).sig.param_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decl).sig.param_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decl).sig.param_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->decl).sig.result_type_names._M_h._M_buckets =
       &(this->decl).sig.result_type_names._M_h._M_single_bucket;
  (this->decl).sig.result_type_names._M_h._M_bucket_count = 1;
  (this->decl).sig.result_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decl).sig.result_type_names._M_h._M_element_count = 0;
  (this->decl).sig.result_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decl).sig.result_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decl).sig.result_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit Tag(std::string_view name) : name(name) {}